

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VWAP.cpp
# Opt level: O2

void __thiscall VWAPOption::computePrice(VWAPOption *this,ofstream *file)

{
  ostream *poVar1;
  int i;
  int iVar2;
  double dVar3;
  double local_b8 [4];
  accumulator_set<double,_stats<tag::mean,_tag::variance_(immediate)>_> price;
  timer t;
  
  boost::timer::auto_cpu_timer::auto_cpu_timer(&t,6);
  price.accumulators.cdr.cdr.cdr.car.super_moment_impl<mpl_::int_<3>,_double>.sum =
       (moment_impl<mpl_::int_<3>,_double>)0.0;
  price.accumulators.car.super_count_impl.cnt = (count_impl)0;
  price.accumulators.cdr.car.super_moment_impl<mpl_::int_<1>,_double>.sum =
       (moment_impl<mpl_::int_<1>,_double>)0.0;
  for (iVar2 = 0; iVar2 < this->NPaths_; iVar2 = iVar2 + 1) {
    local_b8[0] = simulateSinglePath(this);
    if (local_b8[0] <= this->K_) {
      local_b8[0] = 0.0;
      boost::accumulators::
      accumulator_set<double,boost::accumulators::stats<boost::accumulators::tag::mean,boost::accumulators::tag::variance(boost::accumulators::immediate),mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
      ::operator()(&price,local_b8);
    }
    else {
      local_b8[0] = local_b8[0] - this->K_;
      boost::accumulators::
      accumulator_set<double,boost::accumulators::stats<boost::accumulators::tag::mean,boost::accumulators::tag::variance(boost::accumulators::immediate),mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
      ::operator()(&price,local_b8);
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"computation time = ");
  boost::timer::cpu_timer::format_abi_cxx11_((cpu_timer *)local_b8,(short)&t);
  poVar1 = std::operator<<(poVar1,(string *)local_b8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_b8);
  std::operator<<((ostream *)&std::cout,"sigmaPrice = ");
  poVar1 = std::ostream::_M_insert<double>(this->sigmaPrice_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"price = ");
  poVar1 = std::ostream::_M_insert<double>
                     ((double)price.accumulators.cdr.car.super_moment_impl<mpl_::int_<1>,_double>.
                              sum /
                      (((double)CONCAT44(0x45300000,
                                         price.accumulators.car.super_count_impl.cnt._4_4_) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)price.accumulators.car.super_count_impl.cnt)
                      - 4503599627370496.0)));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"stdDevPrice = ");
  if ((double)price.accumulators.cdr.cdr.cdr.car.super_moment_impl<mpl_::int_<3>,_double>.sum < 0.0)
  {
    dVar3 = sqrt((double)price.accumulators.cdr.cdr.cdr.car.super_moment_impl<mpl_::int_<3>,_double>
                         .sum);
  }
  else {
    dVar3 = SQRT((double)price.accumulators.cdr.cdr.cdr.car.super_moment_impl<mpl_::int_<3>,_double>
                         .sum);
  }
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(this->sigmaPrice_);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>
                     ((double)price.accumulators.cdr.car.super_moment_impl<mpl_::int_<1>,_double>.
                              sum /
                      (((double)CONCAT44(0x45300000,
                                         price.accumulators.car.super_count_impl.cnt._4_4_) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)price.accumulators.car.super_count_impl.cnt)
                      - 4503599627370496.0)));
  std::operator<<(poVar1,", ");
  if ((double)price.accumulators.cdr.cdr.cdr.car.super_moment_impl<mpl_::int_<3>,_double>.sum < 0.0)
  {
    dVar3 = sqrt((double)price.accumulators.cdr.cdr.cdr.car.super_moment_impl<mpl_::int_<3>,_double>
                         .sum);
  }
  else {
    dVar3 = SQRT((double)price.accumulators.cdr.cdr.cdr.car.super_moment_impl<mpl_::int_<3>,_double>
                         .sum);
  }
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  boost::timer::auto_cpu_timer::~auto_cpu_timer(&t);
  return;
}

Assistant:

void VWAPOption::computePrice(ofstream& file) {
    timer t;
    accumulator_set<double, stats<tag::mean, tag::variance(immediate) > > price;

    //compute estimate for VWAP price
    for (int i = 0; i < NPaths_; ++i) {
        double VWAP_T = simulateSinglePath();
        if((VWAP_T - K_ ) > 0)
        {
            price(VWAP_T - K_);
        }
        else
        {
            price(0.0);
        }
    }
    cout << std::endl;
    cout << "computation time = " << t.format(3) << std::endl;
    cout << "sigmaPrice = " << sigmaPrice_ << std::endl;
    cout << "price = " << mean(price) << std::endl;
    cout << "stdDevPrice = " << sqrt(variance(price)) << std::endl;

    file << sigmaPrice_
         << ", "
         << mean(price) //option price
         << ", "
         << sqrt(variance(price)) << std::endl;

}